

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::
make_next_equality_node(branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double> *this)

{
  pointer *ppnVar1;
  uint uVar2;
  pointer pnVar3;
  pointer piVar4;
  pointer pcVar5;
  size_type sVar6;
  uint uVar7;
  reference pvVar8;
  ulong uVar9;
  ptrdiff_t _Num;
  uint level;
  uint local_30;
  int local_2c;
  longdouble local_28;
  
  pnVar3 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = pnVar3[-1].level;
  local_30 = uVar7 + 1;
  uVar2 = (this->subvector).m_element_size;
  if (local_30 < uVar2) {
    pnVar3[-1].level = local_30;
    local_28 = pnVar3[-1].sumr;
    pnVar3[-1].z = local_28;
    if (uVar7 + 2 < uVar2) {
      pnVar3[-1].z = (this->items).
                     super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7 + 2].sum_z + local_28;
    }
    uVar7 = pnVar3[-1].variables;
    piVar4 = (this->items).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_28 = piVar4[local_30].r + local_28;
    local_2c = pnVar3[-1].sumfactor + piVar4[local_30].factor;
    pvVar8 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node>>
             ::emplace_back<long_double,int,unsigned_int_const&>
                       ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::node>>
                         *)&this->nodes,&local_28,&local_2c,&local_30);
    sVar6 = shared_subvector::emplace(&this->subvector);
    pvVar8->variables = sVar6;
    uVar9 = (ulong)(this->subvector).m_element_size;
    if (uVar9 != 0) {
      pcVar5 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar5 + sVar6,pcVar5 + uVar7,uVar9);
    }
    uVar9 = (ulong)(local_30 + pvVar8->variables);
    pcVar5 = (this->subvector).m_container.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->subvector).m_container.
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar5) <= uVar9) {
      branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::make_next_equality_node();
    }
    pcVar5[uVar9] = '\x01';
    uVar2 = (this->subvector).m_element_size;
    if (local_30 + 1 < uVar2) {
      pvVar8->z = (this->items).
                  super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_30 + 1].sum_z + pvVar8->sumr;
    }
    if (pvVar8->sumfactor != this->b_min) {
      return;
    }
    if (this->lower_bound < pvVar8->sumr) {
      if ((ulong)uVar2 != 0) {
        pcVar5 = (this->subvector).m_container.
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memmove(pcVar5 + this->solution,pcVar5 + uVar7,(ulong)uVar2);
      }
      uVar7 = local_30 + this->solution;
      pcVar5 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar5[uVar7] = pcVar5[uVar7] == '\0';
      this->lower_bound =
           (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].sumr;
    }
  }
  else {
    pvVar8 = pnVar3 + -1;
  }
  uVar7 = pvVar8->variables;
  shared_subvector::check_index(&this->subvector,uVar7);
  *(size_type *)
   ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
    _M_impl.super__Vector_impl_data._M_start + uVar7) = (this->subvector).m_free_list_head;
  (this->subvector).m_free_list_head = uVar7;
  ppnVar1 = &(this->nodes).
             super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppnVar1 = *ppnVar1 + -1;
  return;
}

Assistant:

void make_next_equality_node()
    {
        node& node_0 = nodes.back();

        const unsigned level = node_0.level + 1;
        if (level >= subvector.element_size()) {
            subvector.remove(node_0.variables);
            nodes.pop_back();
            return;
        }

        node_0.level = level;
        node_0.z = node_0.sumr;

        if (level + 1 < subvector.element_size())
            node_0.z += items[level + 1].sum_z;

        const Float sumr = node_0.sumr;
        const int sumfactor = node_0.sumfactor;
        const unsigned int variables = node_0.variables;

        node& node_1 = nodes.emplace_back(
          sumr + items[level].r, sumfactor + items[level].factor, level);
        node_1.variables = subvector.emplace();
        subvector.copy(variables, node_1.variables);
        subvector[node_1.variables + level] = 1;
        if (level + 1 < subvector.element_size())
            node_1.z = node_1.sumr + items[level + 1].sum_z;

        if (node_1.sumfactor == b_min) {
            if (is_best_solution(node_1.sumr)) {
                subvector.copy(variables, solution);
                subvector.invert(solution, level);
                lower_bound = nodes.back().sumr;
            }
            subvector.remove(node_1.variables);
            nodes.pop_back();
        }
    }